

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::FreeConstraintPS::FreeConstraintPS(FreeConstraintPS *this,FreeConstraintPS *old)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int32_t iVar5;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_006af140;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar4 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar4;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__FreeConstraintPS_006af1e0;
  iVar4 = old->m_old_i;
  this->m_i = old->m_i;
  this->m_old_i = iVar4;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memsize = 0;
  (this->m_row).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  (this->m_row)._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006adc40;
  (this->m_row).theelem =
       (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        *)0x0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::allocMem(&this->m_row,
             (old->m_row).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused);
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator=(&(this->m_row).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,&(old->m_row).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             );
  *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 8) =
       *(undefined8 *)((old->m_row_obj).m_backend.data._M_elems + 8);
  uVar1 = *(undefined8 *)(old->m_row_obj).m_backend.data._M_elems;
  uVar2 = *(undefined8 *)((old->m_row_obj).m_backend.data._M_elems + 2);
  uVar3 = *(undefined8 *)((old->m_row_obj).m_backend.data._M_elems + 6);
  *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 4) =
       *(undefined8 *)((old->m_row_obj).m_backend.data._M_elems + 4);
  *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 6) = uVar3;
  *(undefined8 *)(this->m_row_obj).m_backend.data._M_elems = uVar1;
  *(undefined8 *)((this->m_row_obj).m_backend.data._M_elems + 2) = uVar2;
  (this->m_row_obj).m_backend.exp = (old->m_row_obj).m_backend.exp;
  (this->m_row_obj).m_backend.neg = (old->m_row_obj).m_backend.neg;
  iVar5 = (old->m_row_obj).m_backend.prec_elem;
  (this->m_row_obj).m_backend.fpclass = (old->m_row_obj).m_backend.fpclass;
  (this->m_row_obj).m_backend.prec_elem = iVar5;
  return;
}

Assistant:

FreeConstraintPS(const FreeConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_row(old.m_row)
         , m_row_obj(old.m_row_obj)
      {}